

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_quadratic.h
# Opt level: O0

void __thiscall mp::QuadTerms::QuadTerms(QuadTerms *this,QuadTerms *param_2)

{
  long in_RDI;
  small_vector<int,_6U,_std::allocator<int>_> *this_00;
  small_vector<std::pair<std::pair<int,_int>,_double>,_8U,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_stack_ffffffffffffffb8;
  small_vector<std::pair<std::pair<int,_int>,_double>,_8U,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_stack_ffffffffffffffc0;
  
  gch::
  small_vector<std::pair<std::pair<int,_int>,_double>,_8U,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::small_vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  gch::small_vector<double,_6U,_std::allocator<double>_>::small_vector
            ((small_vector<double,_6U,_std::allocator<double>_> *)in_stack_ffffffffffffffc0,
             (small_vector<double,_6U,_std::allocator<double>_> *)in_stack_ffffffffffffffb8);
  this_00 = (small_vector<int,_6U,_std::allocator<int>_> *)(in_RDI + 0xe0);
  gch::small_vector<int,_6U,_std::allocator<int>_>::small_vector
            (this_00,(small_vector<int,_6U,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
  gch::small_vector<int,_6U,_std::allocator<int>_>::small_vector
            (this_00,(small_vector<int,_6U,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static constexpr const char* GetTypeName() { return "QuadTerms"; }